

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcolor.c
# Opt level: O0

void jinit_color_deconverter(j_decompress_ptr cinfo)

{
  J_COLOR_SPACE JVar1;
  jpeg_color_deconverter *pjVar2;
  int local_1c;
  int ci;
  my_cconvert_ptr cconvert;
  j_decompress_ptr cinfo_local;
  
  pjVar2 = (jpeg_color_deconverter *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x38);
  cinfo->cconvert = pjVar2;
  pjVar2->start_pass = start_pass_dcolor;
  JVar1 = cinfo->jpeg_color_space;
  if (JVar1 == JCS_GRAYSCALE) {
    if (cinfo->num_components != 1) {
      cinfo->err->msg_code = 0xb;
      (*cinfo->err->error_exit)((j_common_ptr)cinfo);
    }
  }
  else if (JVar1 - JCS_RGB < 2) {
    if (cinfo->num_components != 3) {
      cinfo->err->msg_code = 0xb;
      (*cinfo->err->error_exit)((j_common_ptr)cinfo);
    }
  }
  else if (JVar1 - JCS_CMYK < 2) {
    if (cinfo->num_components != 4) {
      cinfo->err->msg_code = 0xb;
      (*cinfo->err->error_exit)((j_common_ptr)cinfo);
    }
  }
  else if (cinfo->num_components < 1) {
    cinfo->err->msg_code = 0xb;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  JVar1 = cinfo->out_color_space;
  if (JVar1 == JCS_GRAYSCALE) {
    cinfo->out_color_components = 1;
    if ((cinfo->jpeg_color_space == JCS_GRAYSCALE) || (cinfo->jpeg_color_space == JCS_YCbCr)) {
      pjVar2->color_convert = grayscale_convert;
      for (local_1c = 1; local_1c < cinfo->num_components; local_1c = local_1c + 1) {
        cinfo->comp_info[local_1c].component_needed = 0;
      }
    }
    else if (cinfo->jpeg_color_space == JCS_RGB) {
      pjVar2->color_convert = rgb_gray_convert;
      build_rgb_y_table(cinfo);
    }
    else {
      cinfo->err->msg_code = 0x1c;
      (*cinfo->err->error_exit)((j_common_ptr)cinfo);
    }
  }
  else if (JVar1 == JCS_RGB) {
    cinfo->out_color_components = 3;
    if (cinfo->jpeg_color_space == JCS_YCbCr) {
      pjVar2->color_convert = ycc_rgb_convert;
      build_ycc_rgb_table(cinfo);
    }
    else if (cinfo->jpeg_color_space == JCS_GRAYSCALE) {
      pjVar2->color_convert = gray_rgb_convert;
    }
    else if (cinfo->jpeg_color_space == JCS_RGB) {
      pjVar2->color_convert = rgb_convert;
    }
    else {
      cinfo->err->msg_code = 0x1c;
      (*cinfo->err->error_exit)((j_common_ptr)cinfo);
    }
  }
  else if (JVar1 == JCS_CMYK) {
    cinfo->out_color_components = 4;
    if (cinfo->jpeg_color_space == JCS_YCCK) {
      pjVar2->color_convert = ycck_cmyk_convert;
      build_ycc_rgb_table(cinfo);
    }
    else if (cinfo->jpeg_color_space == JCS_CMYK) {
      pjVar2->color_convert = null_convert;
    }
    else {
      cinfo->err->msg_code = 0x1c;
      (*cinfo->err->error_exit)((j_common_ptr)cinfo);
    }
  }
  else if (cinfo->out_color_space == cinfo->jpeg_color_space) {
    cinfo->out_color_components = cinfo->num_components;
    pjVar2->color_convert = null_convert;
  }
  else {
    cinfo->err->msg_code = 0x1c;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  if (cinfo->quantize_colors == 0) {
    cinfo->output_components = cinfo->out_color_components;
  }
  else {
    cinfo->output_components = 1;
  }
  return;
}

Assistant:

GLOBAL(void)
jinit_color_deconverter (j_decompress_ptr cinfo)
{
  my_cconvert_ptr cconvert;
  int ci;

  cconvert = (my_cconvert_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_IMAGE,
				SIZEOF(my_color_deconverter));
  cinfo->cconvert = (struct jpeg_color_deconverter *) cconvert;
  cconvert->pub.start_pass = start_pass_dcolor;

  /* Make sure num_components agrees with jpeg_color_space */
  switch (cinfo->jpeg_color_space) {
  case JCS_GRAYSCALE:
    if (cinfo->num_components != 1)
      ERREXIT(cinfo, JERR_BAD_J_COLORSPACE);
    break;

  case JCS_RGB:
  case JCS_YCbCr:
    if (cinfo->num_components != 3)
      ERREXIT(cinfo, JERR_BAD_J_COLORSPACE);
    break;

  case JCS_CMYK:
  case JCS_YCCK:
    if (cinfo->num_components != 4)
      ERREXIT(cinfo, JERR_BAD_J_COLORSPACE);
    break;

  default:			/* JCS_UNKNOWN can be anything */
    if (cinfo->num_components < 1)
      ERREXIT(cinfo, JERR_BAD_J_COLORSPACE);
    break;
  }

  /* Set out_color_components and conversion method based on requested space.
   * Also clear the component_needed flags for any unused components,
   * so that earlier pipeline stages can avoid useless computation.
   */

  switch (cinfo->out_color_space) {
  case JCS_GRAYSCALE:
    cinfo->out_color_components = 1;
    if (cinfo->jpeg_color_space == JCS_GRAYSCALE ||
	cinfo->jpeg_color_space == JCS_YCbCr) {
      cconvert->pub.color_convert = grayscale_convert;
      /* For color->grayscale conversion, only the Y (0) component is needed */
      for (ci = 1; ci < cinfo->num_components; ci++)
	cinfo->comp_info[ci].component_needed = FALSE;
    } else if (cinfo->jpeg_color_space == JCS_RGB) {
      cconvert->pub.color_convert = rgb_gray_convert;
      build_rgb_y_table(cinfo);
    } else
      ERREXIT(cinfo, JERR_CONVERSION_NOTIMPL);
    break;

  case JCS_RGB:
    cinfo->out_color_components = RGB_PIXELSIZE;
    if (cinfo->jpeg_color_space == JCS_YCbCr) {
      cconvert->pub.color_convert = ycc_rgb_convert;
      build_ycc_rgb_table(cinfo);
    } else if (cinfo->jpeg_color_space == JCS_GRAYSCALE) {
      cconvert->pub.color_convert = gray_rgb_convert;
    } else if (cinfo->jpeg_color_space == JCS_RGB) {
      cconvert->pub.color_convert = rgb_convert;
    } else
      ERREXIT(cinfo, JERR_CONVERSION_NOTIMPL);
    break;

  case JCS_CMYK:
    cinfo->out_color_components = 4;
    if (cinfo->jpeg_color_space == JCS_YCCK) {
      cconvert->pub.color_convert = ycck_cmyk_convert;
      build_ycc_rgb_table(cinfo);
    } else if (cinfo->jpeg_color_space == JCS_CMYK) {
      cconvert->pub.color_convert = null_convert;
    } else
      ERREXIT(cinfo, JERR_CONVERSION_NOTIMPL);
    break;

  default:
    /* Permit null conversion to same output space */
    if (cinfo->out_color_space == cinfo->jpeg_color_space) {
      cinfo->out_color_components = cinfo->num_components;
      cconvert->pub.color_convert = null_convert;
    } else			/* unsupported non-null conversion */
      ERREXIT(cinfo, JERR_CONVERSION_NOTIMPL);
    break;
  }

  if (cinfo->quantize_colors)
    cinfo->output_components = 1; /* single colormapped output component */
  else
    cinfo->output_components = cinfo->out_color_components;
}